

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

void envy_bios_print_bit_P(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_bit_entry *peVar1;
  uint32_t uVar2;
  int iVar3;
  uint offset;
  uint32_t addr;
  char *name;
  
  peVar1 = (bios->power).bit;
  if ((mask >> 10 & 1) != 0 && peVar1 != (envy_bios_bit_entry *)0x0) {
    fprintf((FILE *)out,"BIT table \'P\' at 0x%x, version %i\n",(ulong)peVar1->offset,
            (ulong)peVar1->version);
    for (offset = 0; peVar1 = (bios->power).bit, offset < peVar1->t_len; offset = offset + 4) {
      iVar3 = bios_u32(bios,peVar1->t_offset + offset,&addr);
      uVar2 = addr;
      if (addr != 0 && iVar3 == 0) {
        name = "UNKNOWN";
        parse_at(bios,&bios->power,-1,offset,&name);
        fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",(ulong)offset,(ulong)uVar2,name);
      }
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void envy_bios_print_bit_P (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power *power = &bios->power;
	const char *name;
	uint32_t addr;
	int ret = 0, i = 0;
	
	if (!power->bit || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "BIT table 'P' at 0x%x, version %i\n", 
		power->bit->offset, power->bit->version);

	for (i = 0; i < power->bit->t_len; i+=4) {
		ret = bios_u32(bios, power->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, power, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}
	
	fprintf(out, "\n");
}